

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O1

lua_State * lua_newstate(lua_Alloc f,void *ud,uint seed)

{
  lu_byte lVar1;
  TStatus TVar2;
  undefined8 *puVar3;
  lua_State *L;
  
  puVar3 = (undefined8 *)(*f)(ud,(void *)0x0,8,0x658);
  L = (lua_State *)0x0;
  if (puVar3 != (undefined8 *)0x0) {
    L = (lua_State *)(puVar3 + 0xb1);
    *(undefined4 *)(puVar3 + 0xb2) = 0x10808;
    *(undefined1 *)((long)puVar3 + 0x6a) = 8;
    puVar3[0xb4] = puVar3;
    puVar3[0xb7] = 0;
    puVar3[0xb8] = 0;
    puVar3[0xb5] = 0;
    *(undefined4 *)(puVar3 + 200) = 0;
    puVar3[0xbb] = L;
    puVar3[0xbc] = 0;
    puVar3[0xc5] = 0;
    *(undefined4 *)((long)puVar3 + 0x64c) = 0;
    *(undefined8 *)((long)puVar3 + 0x644) = 0;
    puVar3[0xc6] = 0;
    puVar3[199] = 0;
    puVar3[0xbf] = 0;
    puVar3[0xc0] = 0;
    puVar3[0xe] = L;
    puVar3[0xb1] = 0;
    *(undefined4 *)(puVar3 + 199) = 0x10000;
    *puVar3 = f;
    puVar3[1] = ud;
    puVar3[0xae] = 0;
    puVar3[0xaf] = 0;
    *(uint *)(puVar3 + 0xc) = seed;
    *(undefined2 *)((long)puVar3 + 0x6e) = 2;
    *(undefined1 *)(puVar3 + 9) = 0;
    puVar3[0x20] = 0;
    puVar3[6] = 0;
    puVar3[7] = 0;
    *(undefined2 *)((long)puVar3 + 0x6b) = 8;
    *(undefined1 *)((long)puVar3 + 0x6d) = 0;
    memset(puVar3 + 0xf,0,0x88);
    puVar3[2] = 0x658;
    puVar3[10] = 0;
    puVar3[3] = 0;
    puVar3[4] = 0;
    *(undefined1 *)(puVar3 + 0xb) = 3;
    lVar1 = luaO_codeparam(0xfa);
    *(lu_byte *)((long)puVar3 + 0x67) = lVar1;
    lVar1 = luaO_codeparam(200);
    *(lu_byte *)(puVar3 + 0xd) = lVar1;
    lVar1 = luaO_codeparam(0x2580);
    *(lu_byte *)((long)puVar3 + 0x69) = lVar1;
    lVar1 = luaO_codeparam(0x14);
    *(lu_byte *)((long)puVar3 + 100) = lVar1;
    lVar1 = luaO_codeparam(0x46);
    *(lu_byte *)((long)puVar3 + 0x66) = lVar1;
    lVar1 = luaO_codeparam(0x32);
    *(lu_byte *)((long)puVar3 + 0x65) = lVar1;
    puVar3[0x3b] = 0;
    puVar3[0x3c] = 0;
    puVar3[0x3d] = 0;
    puVar3[0x3e] = 0;
    puVar3[0x3f] = 0;
    puVar3[0x40] = 0;
    puVar3[0x41] = 0;
    puVar3[0x42] = 0;
    puVar3[0x43] = 0;
    TVar2 = luaD_rawrunprotected(L,f_luaopen,(void *)0x0);
    if (TVar2 != '\0') {
      close_state(L);
      L = (lua_State *)0x0;
    }
  }
  return L;
}

Assistant:

LUA_API lua_State *lua_newstate (lua_Alloc f, void *ud, unsigned seed) {
  int i;
  lua_State *L;
  global_State *g = cast(global_State*,
                       (*f)(ud, NULL, LUA_TTHREAD, sizeof(global_State)));
  if (g == NULL) return NULL;
  L = &g->mainth.l;
  L->tt = LUA_VTHREAD;
  g->currentwhite = bitmask(WHITE0BIT);
  L->marked = luaC_white(g);
  preinit_thread(L, g);
  g->allgc = obj2gco(L);  /* by now, only object is the main thread */
  L->next = NULL;
  incnny(L);  /* main thread is always non yieldable */
  g->frealloc = f;
  g->ud = ud;
  g->warnf = NULL;
  g->ud_warn = NULL;
  g->seed = seed;
  g->gcstp = GCSTPGC;  /* no GC while building state */
  g->strt.size = g->strt.nuse = 0;
  g->strt.hash = NULL;
  setnilvalue(&g->l_registry);
  g->panic = NULL;
  g->gcstate = GCSpause;
  g->gckind = KGC_INC;
  g->gcstopem = 0;
  g->gcemergency = 0;
  g->finobj = g->tobefnz = g->fixedgc = NULL;
  g->firstold1 = g->survival = g->old1 = g->reallyold = NULL;
  g->finobjsur = g->finobjold1 = g->finobjrold = NULL;
  g->sweepgc = NULL;
  g->gray = g->grayagain = NULL;
  g->weak = g->ephemeron = g->allweak = NULL;
  g->twups = NULL;
  g->GCtotalbytes = sizeof(global_State);
  g->GCmarked = 0;
  g->GCdebt = 0;
  setivalue(&g->nilvalue, 0);  /* to signal that state is not yet built */
  setgcparam(g, PAUSE, LUAI_GCPAUSE);
  setgcparam(g, STEPMUL, LUAI_GCMUL);
  setgcparam(g, STEPSIZE, LUAI_GCSTEPSIZE);
  setgcparam(g, MINORMUL, LUAI_GENMINORMUL);
  setgcparam(g, MINORMAJOR, LUAI_MINORMAJOR);
  setgcparam(g, MAJORMINOR, LUAI_MAJORMINOR);
  for (i=0; i < LUA_NUMTYPES; i++) g->mt[i] = NULL;
  if (luaD_rawrunprotected(L, f_luaopen, NULL) != LUA_OK) {
    /* memory allocation error: free partial state */
    close_state(L);
    L = NULL;
  }
  return L;
}